

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

TextureData __thiscall QRhiWidgetPrivate::texture(QRhiWidgetPrivate *this)

{
  long lVar1;
  QRhiResource **ppQVar2;
  long *plVar3;
  QRhiTexture *pQVar4;
  long lVar5;
  TextureData TVar6;
  
  lVar1 = (this->pendingDeletes).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->pendingDeletes).d.ptr;
    lVar5 = 0;
    do {
      plVar3 = *(long **)((long)ppQVar2 + lVar5);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
  }
  QList<QRhiResource_*>::clear(&this->pendingDeletes);
  pQVar4 = this->resolveTexture;
  if (pQVar4 == (QRhiTexture *)0x0) {
    pQVar4 = this->colorTexture;
  }
  if (this->textureInvalid != false) {
    pQVar4 = (QRhiTexture *)0x0;
  }
  TVar6.textureRight = (QRhiTexture *)0x0;
  TVar6.textureLeft = pQVar4;
  return TVar6;
}

Assistant:

QWidgetPrivate::TextureData QRhiWidgetPrivate::texture() const
{
    // This is the only safe place to clear pendingDeletes, due to the
    // possibility of the texture returned in the previous invocation of this
    // function having been added to pendingDeletes, meaning the object then
    // needs to be valid until the next (this) invocation of this function.
    // (the exact object lifetime requirements depend on the
    // QWidget/RepaintManager internal implementation; for now avoid relying on
    // such details by clearing pendingDeletes only here, not in endCompose())
    qDeleteAll(pendingDeletes);
    pendingDeletes.clear();

    TextureData td;
    if (!textureInvalid)
        td.textureLeft = resolveTexture ? resolveTexture : colorTexture;
    return td;
}